

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O2

void math::internal::matrix_gk_svd<double>
               (double *mat_a,int rows,int cols,double *mat_u,double *vec_s,double *mat_v,
               double *epsilon)

{
  double *mat_q;
  double *mat_b;
  double *pdVar1;
  bool bVar2;
  int i;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  long lVar12;
  pointer pdVar13;
  double *pdVar14;
  double *pdVar15;
  int iVar16;
  int iVar17;
  double *pdVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  double *pdVar25;
  int row_index;
  int p;
  int iVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  int iVar30;
  long lVar32;
  uint uVar33;
  undefined1 local_150 [8];
  vector<double,_std::allocator<double>_> buffer;
  vector<double,_std::allocator<double>_> mat_b33;
  allocator_type local_41;
  double *local_40;
  ulong local_38;
  ulong uVar31;
  
  uVar22 = rows * rows;
  iVar26 = cols * rows;
  uVar29 = cols * cols;
  uVar31 = (ulong)uVar29;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_150,
             (long)(int)(uVar22 + (iVar26 + uVar29) * 2),
             (allocator_type *)
             &buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pdVar7 = (double *)((long)local_150 + (ulong)uVar22 * 8);
  lVar28 = (long)iVar26;
  pdVar15 = pdVar7 + lVar28;
  local_40 = (double *)local_150;
  local_38 = (ulong)uVar22;
  matrix_bidiagonalize<double>(mat_a,rows,cols,(double *)local_150,pdVar7,pdVar15,epsilon);
  uVar21 = local_38;
  pdVar1 = local_40;
  mat_q = pdVar15 + uVar31;
  mat_b = mat_q + lVar28;
  uVar5 = 0;
  pdVar10 = (double *)0x0;
  if (0 < cols) {
    pdVar10 = (double *)(ulong)(uint)cols;
  }
  uVar11 = 0;
  if (0 < rows) {
    uVar11 = (ulong)(uint)rows;
  }
  pdVar18 = local_40 + uVar31 + lVar28 + local_38;
  pdVar14 = local_40;
  for (; uVar5 != uVar11; uVar5 = uVar5 + 1) {
    for (pdVar25 = (double *)0x0; pdVar10 != pdVar25; pdVar25 = (double *)((long)pdVar25 + 1)) {
      pdVar18[(long)pdVar25] = pdVar14[(long)pdVar25];
    }
    pdVar18 = pdVar18 + cols;
    pdVar14 = pdVar14 + rows;
  }
  if (cols != 0) {
    memmove(mat_b,pdVar7,uVar31 * 8);
  }
  uVar22 = cols - 1;
  iVar30 = cols + 1;
  iVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar22) {
    uVar5 = (ulong)uVar22;
  }
  iVar23 = 0;
  if (0 < iVar26) {
    iVar23 = iVar26;
  }
LAB_0010edfb:
  do {
    if (iVar4 == iVar23) {
LAB_0010f13c:
      if (iVar26 != 0) {
        memmove(mat_u,mat_q,lVar28 << 3);
      }
      if (cols != 0) {
        memmove(mat_v,pdVar15,uVar31 << 3);
      }
      iVar26 = 0;
      for (pdVar7 = (double *)0x0; pdVar10 != pdVar7; pdVar7 = (double *)((long)pdVar7 + 1)) {
        vec_s[(long)pdVar7] = mat_b[iVar26];
        iVar26 = iVar26 + iVar30;
      }
      for (pdVar7 = (double *)0x0; pdVar7 != pdVar10; pdVar7 = (double *)((long)pdVar7 + 1)) {
        if (vec_s[(long)pdVar7] < *epsilon) {
          vec_s[(long)pdVar7] = -vec_s[(long)pdVar7];
          pdVar15 = mat_u;
          uVar21 = uVar11;
          while (bVar2 = uVar21 != 0, uVar21 = uVar21 - 1, bVar2) {
            *pdVar15 = -*pdVar15;
            pdVar15 = pdVar15 + cols;
          }
        }
        mat_u = mat_u + 1;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)local_150);
      return;
    }
    for (uVar6 = 0; uVar31 != uVar6; uVar6 = uVar6 + 1) {
      if ((0.0 - *epsilon <= pdVar1[uVar31 + uVar21 + lVar28 * 2 + uVar6]) &&
         (pdVar1[uVar31 + uVar21 + lVar28 * 2 + uVar6] <= *epsilon)) {
        pdVar1[uVar31 + uVar21 + lVar28 * 2 + uVar6] = 0.0;
      }
    }
    pdVar7 = pdVar1 + uVar21 + uVar31 + lVar28 * 2 + 1;
    iVar3 = iVar30;
    for (lVar12 = 1; lVar12 - uVar5 != 1; lVar12 = lVar12 + 1) {
      if (ABS(*pdVar7) <= ABS(pdVar7[-1] + mat_b[iVar3]) * *epsilon) {
        *pdVar7 = 0.0;
      }
      pdVar7 = pdVar7 + (long)cols + 1;
      iVar3 = iVar3 + iVar30;
    }
    iVar4 = iVar4 + 1;
    lVar12 = 8;
    lVar32 = 1;
    local_40 = (double *)0x0;
    pdVar7 = (double *)0x0;
    local_38 = (ulong)(uVar29 - 1);
    while (pdVar7 != pdVar10) {
      pdVar14 = (double *)((long)pdVar7 + 1);
      iVar3 = (int)pdVar14;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)(uint)(iVar3 * iVar3),&local_41);
      uVar6 = local_38;
      pdVar13 = buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      for (lVar19 = 0; lVar19 != lVar32; lVar19 = lVar19 + 1) {
        for (lVar24 = 0; lVar32 != lVar24; lVar24 = lVar24 + 1) {
          pdVar13[lVar24] = mat_b[(int)uVar6 + (int)lVar24];
        }
        pdVar13 = (pointer)((long)pdVar13 + lVar12);
        uVar6 = uVar6 + (uint)cols;
      }
      bVar2 = matrix_is_diagonal<double>
                        (buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,iVar3,iVar3,epsilon);
      if (bVar2) {
        pdVar18 = pdVar14;
        if (((long)pdVar7 < (long)(int)uVar22) &&
           (bVar2 = matrix_is_submatrix_zero_enclosed<double>(mat_b,cols,iVar3,epsilon),
           pdVar18 = local_40, bVar2)) {
          pdVar18 = pdVar14;
        }
        local_40 = (double *)((ulong)pdVar18 & 0xffffffff);
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)
                 &buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      lVar32 = lVar32 + 1;
      lVar12 = lVar12 + 8;
      local_38 = local_38 + (uint)~cols;
      pdVar7 = pdVar14;
    }
    uVar27 = (uint)local_40;
    uVar33 = cols - uVar27;
    pdVar7 = (double *)operator_new__((ulong)(uVar33 * uVar33) << 3);
    uVar20 = 0;
    uVar6 = 0;
    if (0 < (int)uVar33) {
      uVar6 = (ulong)uVar33;
    }
    uVar9 = (ulong)(~uVar27 + cols * uVar33);
    lVar12 = 8;
    lVar32 = 1;
    local_38 = local_38 & 0xffffffff00000000;
    while (uVar20 != uVar6) {
      uVar20 = uVar20 + 1;
      uVar8 = uVar9;
      pdVar14 = pdVar7;
      for (lVar19 = 0; lVar19 != lVar32; lVar19 = lVar19 + 1) {
        for (lVar24 = 0; lVar32 != lVar24; lVar24 = lVar24 + 1) {
          pdVar14[lVar24] = mat_b[(int)uVar8 + (int)lVar24];
        }
        pdVar14 = (double *)((long)pdVar14 + lVar12);
        uVar8 = uVar8 + (uint)cols;
      }
      iVar16 = (int)uVar20;
      bVar2 = matrix_is_superdiagonal_nonzero<double>(pdVar7,iVar16,iVar16,epsilon);
      iVar3 = (int)local_38;
      if (bVar2) {
        iVar3 = iVar16;
      }
      local_38 = CONCAT44(local_38._4_4_,iVar3);
      lVar32 = lVar32 + 1;
      lVar12 = lVar12 + 8;
      uVar9 = uVar9 + (uint)~cols;
    }
    operator_delete__(pdVar7);
    iVar3 = (int)local_40;
    if (cols == iVar3) goto LAB_0010f13c;
    p = uVar33 - (int)local_38;
    lVar12 = (long)p;
    row_index = (uVar22 - iVar3) - (int)local_38;
    iVar16 = iVar30 * p;
    do {
      iVar17 = iVar16;
      if ((int)(uVar33 - 1) <= lVar12) {
        matrix_gk_svd_step<double>(rows,cols,mat_b,mat_q,pdVar15,p,iVar3,epsilon);
        goto LAB_0010edfb;
      }
      lVar12 = lVar12 + 1;
      row_index = row_index + 1;
      iVar16 = iVar17 + iVar30;
    } while ((mat_b[iVar17] < 0.0 - *epsilon) || (*epsilon < mat_b[iVar17]));
    mat_b[iVar17] = 0.0;
    matrix_svd_clear_super_entry<double>(rows,cols,mat_b,mat_q,row_index,epsilon);
  } while( true );
}

Assistant:

void
matrix_gk_svd (T const* mat_a, int rows, int cols,
    T* mat_u, T* vec_s, T* mat_v, T const& epsilon)
{
    /* Allocate memory for temp matrices. */
    int const mat_q_full_size = rows * rows;
    int const mat_b_full_size = rows * cols;
    int const mat_p_size = cols * cols;
    int const mat_q_size = rows * cols;
    int const mat_b_size = cols * cols;

    std::vector<T> buffer(mat_q_full_size + mat_b_full_size
        + mat_p_size + mat_q_size + mat_b_size);
    T* mat_q_full = &buffer[0];
    T* mat_b_full = mat_q_full + mat_q_full_size;
    T* mat_p = mat_b_full + mat_b_full_size;
    T* mat_q = mat_p + mat_p_size;
    T* mat_b = mat_q + mat_q_size;

    matrix_bidiagonalize(mat_a, rows, cols,
        mat_q_full, mat_b_full, mat_p, epsilon);

    /* Extract smaller matrices. */
    for (int i = 0; i < rows; ++i)
    {
        for (int j = 0; j < cols; ++j)
        {
            mat_q[i * cols + j] = mat_q_full[i * rows + j];
        }
    }
    std::copy(mat_b_full, mat_b_full + cols * cols, mat_b);

    /* Avoid infinite loops and exit after maximum number of iterations. */
    int const max_iterations = rows * cols;
    int iteration = 0;
    while (iteration < max_iterations)
    {
        iteration += 1;

        /* Enforce exact zeros for numerical stability. */
        for (int i = 0; i < cols * cols; ++i)
        {
            T const& entry = mat_b[i];
            if (MATH_EPSILON_EQ(entry, T(0), epsilon))
                mat_b[i] = T(0);
        }

        /* GK 2a. */
        for (int i = 0; i < (cols - 1); ++i)
        {
            if (std::abs(mat_b[i * cols + (i + 1)]) <= epsilon *
                std::abs(mat_b[i * cols + i] + mat_b[(i + 1) * cols + (i + 1)]))
            {
                mat_b[i * cols + (i + 1)] = T(0);
            }
        }

        /* GK 2b. */
        /* Select q such that b33 is diagonal and blocked by zeros. */
        int q = 0;
        for (int k = 0; k < cols; ++k)
        {
            int const slice_len = k + 1;
            std::vector<T> mat_b33(slice_len * slice_len);
            for (int i = 0; i < slice_len; ++i)
            {
                for (int j = 0; j < slice_len; ++j)
                {
                    mat_b33[i * slice_len + j]
                        = mat_b[(cols - k - 1 + i) * cols + (cols - k - 1 + j)];
                }
            }

            if (matrix_is_diagonal(&mat_b33[0], slice_len, slice_len, epsilon))
            {
                if (k < cols - 1)
                {
                    if (matrix_is_submatrix_zero_enclosed(
                        mat_b, cols, k + 1, epsilon))
                    {
                        q = k + 1;
                    }
                }
                else
                {
                    q = k + 1;
                }
            }
        }

        /* Select z := n-p-q such that B22 has no zero superdiagonal entry. */
        int z = 0;
        T* mat_b22_tmp = new T[(cols - q) * (cols - q)];
        for (int k = 0; k < (cols - q); ++k)
        {
            int const slice_len = k + 1;
            for (int i = 0; i < slice_len; ++i)
            {
                for (int j = 0; j < slice_len; ++j)
                {
                    mat_b22_tmp[i * slice_len + j]
                        = mat_b[(cols - q - k - 1 + i)
                        * cols + (cols - q - k - 1 + j)];
                }
            }
            if (matrix_is_superdiagonal_nonzero(
                mat_b22_tmp, slice_len, slice_len, epsilon))
            {
                z = k + 1;
            }
        }
        delete[] mat_b22_tmp;

        int const p = cols - q - z;

        /* GK 2c. */
        if (q == cols)
            break;

        bool diagonal_non_zero = true;
        int nz = 0;
        for (nz = p; nz < (cols - q - 1); ++nz)
        {
            if (MATH_EPSILON_EQ(mat_b[nz * cols + nz], T(0), epsilon))
            {
                diagonal_non_zero = false;
                mat_b[nz * cols + nz] = T(0);
                break;
            }
        }

        if (diagonal_non_zero)
            matrix_gk_svd_step(rows, cols, mat_b, mat_q, mat_p, p, q, epsilon);
        else
            matrix_svd_clear_super_entry(rows, cols, mat_b, mat_q, nz, epsilon);
    }

    /* Create resulting matrices and vector from temporary entities. */
    std::copy(mat_q, mat_q + rows * cols, mat_u);
    std::copy(mat_p, mat_p + cols * cols, mat_v);
    for (int i = 0; i < cols; ++i)
        vec_s[i] = mat_b[i * cols + i];

    /* Correct signs. */
    for (int i = 0; i < cols; ++i)
    {
        if (vec_s[i] < epsilon)
        {
            vec_s[i] = -vec_s[i];
            for (int j = 0; j < rows; ++j)
            {
                int index = j * cols + i;
                mat_u[index] = -mat_u[index];
            }
        }
    }
}